

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution::forward_int8(Convolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  int *piVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined1 uVar9;
  undefined1 uVar11;
  undefined1 uVar13;
  undefined1 uVar15;
  undefined4 uVar16;
  undefined1 uVar17;
  undefined1 uVar19;
  undefined1 uVar21;
  undefined1 uVar23;
  undefined4 uVar24;
  undefined1 uVar25;
  undefined1 uVar27;
  undefined1 uVar29;
  undefined1 uVar31;
  undefined8 uVar32;
  Mat *pMVar39;
  int iVar40;
  pointer piVar41;
  undefined1 uVar42;
  int iVar43;
  int iVar44;
  ulong uVar45;
  int iVar46;
  int iVar47;
  long lVar48;
  int k;
  ulong uVar49;
  float *pfVar50;
  ulong __n;
  int iVar51;
  bool bVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  Option opt_g;
  vector<int,_std::allocator<int>_> _space_ofs;
  long local_138;
  allocator_type local_129;
  ulong local_128;
  int local_120;
  int local_11c;
  Mat local_118;
  Mat *local_d0;
  ulong local_c8;
  ulong local_c0;
  Mat local_b8;
  long local_70;
  long local_68;
  vector<int,_std::allocator<int>_> local_60;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uVar10;
  undefined3 uVar12;
  undefined2 uVar14;
  undefined4 uVar18;
  undefined3 uVar20;
  undefined2 uVar22;
  undefined4 uVar26;
  undefined3 uVar28;
  undefined2 uVar30;
  undefined1 uVar33;
  undefined1 uVar34;
  undefined3 uVar35;
  undefined1 uVar36;
  undefined2 uVar37;
  undefined1 uVar38;
  
  uVar3 = bottom_blob->c;
  iVar51 = this->kernel_w;
  iVar47 = this->dilation_w;
  iVar4 = this->kernel_h;
  iVar43 = this->dilation_h;
  sVar5 = bottom_blob->elemsize;
  local_118.data = bottom_blob->data;
  piVar6 = bottom_blob->refcount;
  local_118.refcount._0_4_ = SUB84(piVar6,0);
  local_118.refcount._4_4_ = (undefined4)((ulong)piVar6 >> 0x20);
  local_118.elemsize._0_4_ = (undefined4)sVar5;
  local_118.elemsize._4_4_ = (undefined4)(sVar5 >> 0x20);
  local_118.elempack = bottom_blob->elempack;
  local_118.allocator = bottom_blob->allocator;
  local_118.dims = bottom_blob->dims;
  local_118.w = bottom_blob->w;
  local_118.h = bottom_blob->h;
  local_118.d = bottom_blob->d;
  local_118.cstep = bottom_blob->cstep;
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + 1;
    UNLOCK();
  }
  local_118.c = uVar3;
  local_d0 = top_blob;
  if (sVar5 != 1) {
    local_b8.data = *(void **)opt;
    uVar8 = opt->openmp_blocktime;
    uVar9 = opt->use_winograd_convolution;
    uVar11 = opt->use_sgemm_convolution;
    uVar13 = opt->use_int8_inference;
    uVar15 = opt->use_vulkan_compute;
    uVar14 = CONCAT11(uVar15,uVar13);
    uVar12 = CONCAT21(uVar14,uVar11);
    uVar10 = CONCAT31(uVar12,uVar9);
    local_b8.allocator = *(Allocator **)&opt->use_bf16_storage;
    uVar16 = opt->vulkan_device_index;
    uVar17 = opt->use_reserved_1;
    uVar19 = opt->use_image_storage;
    uVar21 = opt->use_tensor_storage;
    uVar23 = opt->use_reserved_2;
    uVar22 = CONCAT11(uVar23,uVar21);
    uVar20 = CONCAT21(uVar22,uVar19);
    uVar18 = CONCAT31(uVar20,uVar17);
    uVar24 = opt->flush_denormals;
    uVar25 = opt->use_local_pool_allocator;
    uVar27 = opt->use_shader_local_memory;
    uVar29 = opt->use_cooperative_matrix;
    uVar31 = opt->use_winograd23_convolution;
    uVar30 = CONCAT11(uVar31,uVar29);
    uVar28 = CONCAT21(uVar30,uVar27);
    uVar26 = CONCAT31(uVar28,uVar25);
    uVar32._0_1_ = opt->use_winograd43_convolution;
    uVar32._1_1_ = opt->use_winograd63_convolution;
    uVar32._2_1_ = opt->use_a53_a55_optimized_kernel;
    uVar32._3_1_ = opt->use_fp16_uniform;
    uVar33 = opt->use_int8_uniform;
    uVar34 = opt->use_reserved_9;
    uVar36 = opt->use_reserved_10;
    uVar38 = opt->use_reserved_11;
    uVar37 = CONCAT11(uVar38,uVar36);
    uVar35 = CONCAT21(uVar37,uVar34);
    uVar32._4_4_ = CONCAT31(uVar35,uVar33);
    local_b8.c = (int)uVar32;
    local_b8.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
    local_b8.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_b8.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    local_b8.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_b8.elempack = uVar8;
    local_b8._28_4_ = uVar10;
    local_b8.dims = uVar16;
    local_b8.w = uVar18;
    local_b8.h = uVar24;
    local_b8.d = uVar26;
    local_b8._60_4_ = uVar32._4_4_;
    quantize_to_int8(bottom_blob,&local_118,&this->bottom_blob_int8_scales,(Option *)&local_b8);
    if ((local_118.data == (void *)0x0) || ((long)local_118.c * local_118.cstep == 0)) {
      iVar44 = -100;
      goto LAB_0014c6e0;
    }
  }
  local_b8.cstep = 0;
  local_b8.data = (void *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize._0_4_ = 0;
  local_b8.elemsize._4_4_ = 0;
  local_b8.elempack = 0;
  local_b8.allocator = (Allocator *)0x0;
  local_b8.dims = 0;
  local_b8.w = 0;
  local_b8.h = 0;
  local_b8.d = 0;
  local_b8.c = 0;
  make_padding(this,&local_118,&local_b8,this->kernel_w,this->kernel_h,opt);
  iVar40 = local_b8.w;
  iVar44 = -100;
  if ((local_b8.data != (void *)0x0) && ((long)local_b8.c * local_b8.cstep != 0)) {
    uVar45 = (long)(~((iVar51 + -1) * iVar47) + local_b8.w) / (long)this->stride_w;
    uVar49 = (long)(~((iVar4 + -1) * iVar43) + local_b8.h) / (long)this->stride_h;
    __n = (long)this->kernel_h * (long)this->kernel_w;
    std::vector<int,_std::allocator<int>_>::vector(&local_60,__n,&local_129);
    piVar41 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    pMVar39 = local_d0;
    if (0 < this->kernel_h) {
      iVar51 = this->dilation_h;
      iVar47 = this->dilation_w;
      iVar4 = this->kernel_w;
      iVar43 = 0;
      iVar44 = 0;
      iVar46 = 0;
      do {
        if (0 < this->kernel_w) {
          lVar48 = 0;
          do {
            local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar43 + lVar48] = iVar46;
            iVar46 = iVar46 + this->dilation_w;
            lVar48 = lVar48 + 1;
          } while ((int)lVar48 < this->kernel_w);
          iVar43 = iVar43 + (int)lVar48;
        }
        iVar46 = iVar46 + (iVar40 * iVar51 - iVar47 * iVar4);
        iVar44 = iVar44 + 1;
      } while (iVar44 < this->kernel_h);
    }
    local_11c = this->int8_scale_term;
    local_c8 = uVar49 & 0xffffffff;
    local_c0 = uVar45 & 0xffffffff;
    Mat::create(local_d0,(int)uVar45 + 1,(int)uVar49 + 1,this->num_output,
                (ulong)(local_11c < 0x65) * 3 + 1,opt->blob_allocator);
    iVar44 = -100;
    if ((pMVar39->data != (void *)0x0) && ((long)pMVar39->c * pMVar39->cstep != 0)) {
      if (0 < this->num_output) {
        local_120 = uVar3 * (int)__n;
        local_138 = 0;
        uVar45 = local_c8;
        do {
          if (-1 < (int)uVar45) {
            pfVar50 = (float *)(local_d0->cstep * local_138 * local_d0->elemsize +
                               (long)local_d0->data);
            local_70 = (long)(local_120 * (int)local_138);
            local_128 = 0;
            do {
              if (-1 < (int)local_c0) {
                local_68 = (long)(int)local_128;
                iVar51 = 0;
                do {
                  fVar55 = 0.0;
                  fVar53 = 0.0;
                  if (0 < (int)uVar3) {
                    lVar48 = (long)(this->weight_data).data + local_70;
                    uVar45 = 0;
                    iVar47 = 0;
                    do {
                      if (0 < (int)__n) {
                        uVar49 = 0;
                        do {
                          iVar47 = iVar47 + (int)*(char *)(lVar48 + uVar49) *
                                            (int)*(char *)((long)local_b8.data +
                                                          (long)piVar41[uVar49] +
                                                          local_b8.cstep *
                                                          CONCAT44(local_b8.elemsize._4_4_,
                                                                   (undefined4)local_b8.elemsize) *
                                                          uVar45 + (long)iVar51 *
                                                                   (long)this->stride_w +
                                                                   (long)local_b8.w *
                                                                   CONCAT44(local_b8.elemsize._4_4_,
                                                                            (undefined4)
                                                                            local_b8.elemsize) *
                                                                   this->stride_h * local_68);
                          uVar49 = uVar49 + 1;
                        } while ((__n & 0xffffffff) != uVar49);
                      }
                      lVar48 = lVar48 + __n;
                      uVar45 = uVar45 + 1;
                    } while (uVar45 != uVar3);
                    fVar53 = (float)iVar47;
                  }
                  fVar1 = *(float *)((long)(this->weight_data_int8_scales).data + local_138 * 4);
                  if (fVar1 != 0.0) {
                    fVar55 = 1.0 / (fVar1 * *(this->bottom_blob_int8_scales).data);
                  }
                  fVar55 = fVar55 * fVar53;
                  if (this->bias_term != 0) {
                    fVar55 = fVar55 + *(float *)((long)(this->bias_data).data + local_138 * 4);
                  }
                  fVar53 = fVar55;
                  switch(this->activation_type) {
                  case 1:
                    if (fVar55 <= 0.0) {
                      fVar53 = 0.0;
                    }
                    break;
                  case 2:
                    fVar53 = (float)(~-(uint)(0.0 < fVar55) & *(this->activation_params).data |
                                    -(uint)(0.0 < fVar55) & 0x3f800000) * fVar55;
                    break;
                  case 3:
                    pfVar7 = (float *)(this->activation_params).data;
                    fVar53 = *pfVar7;
                    if (fVar55 <= fVar53) {
                      fVar55 = fVar53;
                    }
                    fVar53 = pfVar7[1];
                    if (fVar55 <= fVar53) {
                      fVar53 = fVar55;
                    }
                    break;
                  case 4:
                    if (88.37626 <= fVar55) {
                      fVar55 = 88.37626;
                    }
                    fVar53 = expf((float)(-(uint)(fVar55 < -88.37626) & 0x42b0c0a5 |
                                         ~-(uint)(fVar55 < -88.37626) & (uint)-fVar55));
                    fVar53 = 1.0 / (fVar53 + 1.0);
                    break;
                  case 5:
                    uStack_44 = 0;
                    uStack_40 = 0;
                    uStack_3c = 0;
                    local_48 = fVar55;
                    fVar53 = expf(fVar55);
                    fVar53 = logf(fVar53 + 1.0);
                    fVar53 = tanhf(fVar53);
                    fVar53 = fVar53 * local_48;
                    break;
                  case 6:
                    pfVar7 = (float *)(this->activation_params).data;
                    fVar1 = *pfVar7;
                    fVar2 = pfVar7[1];
                    fVar54 = -fVar2 / fVar1;
                    fVar53 = 0.0;
                    if ((fVar54 <= fVar55) && (fVar53 = fVar55, fVar55 <= fVar54 + 1.0 / fVar1)) {
                      fVar53 = (fVar1 * fVar55 + fVar2) * fVar55;
                    }
                  }
                  if (local_11c < 0x65) {
                    *pfVar50 = fVar53;
                    lVar48 = 4;
                  }
                  else {
                    fVar53 = roundf(fVar53 * *(this->top_blob_int8_scales).data);
                    iVar47 = (int)fVar53;
                    if (iVar47 < -0x7e) {
                      iVar47 = -0x7f;
                    }
                    uVar42 = (undefined1)iVar47;
                    if (0x7e < iVar47) {
                      uVar42 = 0x7f;
                    }
                    *(undefined1 *)pfVar50 = uVar42;
                    lVar48 = 1;
                  }
                  pfVar50 = (float *)((long)pfVar50 + lVar48);
                  bVar52 = iVar51 != (int)local_c0;
                  iVar51 = iVar51 + 1;
                } while (bVar52);
              }
              iVar51 = (int)local_128;
              local_128 = (ulong)(iVar51 + 1);
              uVar45 = local_c8;
            } while (iVar51 != (int)local_c8);
          }
          local_138 = local_138 + 1;
        } while (local_138 < this->num_output);
      }
      iVar44 = 0;
    }
    if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  piVar6 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if (local_b8.data != (void *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_b8.cstep = 0;
  local_b8.data = (void *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize._0_4_ = 0;
  local_b8.elemsize._4_4_ = 0;
  local_b8.elempack = 0;
  local_b8.dims = 0;
  local_b8.w = 0;
  local_b8.h = 0;
  local_b8.d = 0;
  local_b8.c = 0;
LAB_0014c6e0:
  piVar6 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_118.allocator == (Allocator *)0x0) {
        if (local_118.data != (void *)0x0) {
          free(local_118.data);
        }
      }
      else {
        (*(local_118.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar44;
}

Assistant:

int Convolution::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Convolution input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (elemsize != 1)
    {
        Option opt_g = opt;
        opt_g.blob_allocator = opt.workspace_allocator;

        quantize_to_int8(bottom_blob, bottom_blob_unbordered, bottom_blob_int8_scales, opt_g);
        if (bottom_blob_unbordered.empty())
            return -100;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_unbordered, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // int8
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u : 4u;

    top_blob.create(outw, outh, num_output, out_elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        signed char* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                int sum = 0;

                const signed char* kptr = (const signed char*)weight_data + maxk * channels * p;

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    const signed char* sptr = m.row<signed char>(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        int val = sptr[space_ofs[k]];
                        int wt = kptr[k];
                        sum += val * wt;
                    }

                    kptr += maxk;
                }

                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                float sumfp32 = sum * scale_in;

                if (bias_term)
                    sumfp32 += bias_data[p];

                sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                if (use_int8_requantize)
                {
                    // requantize
                    float scale_out = top_blob_int8_scales[0];
                    signed char sums8 = float2int8(sumfp32 * scale_out);
                    outptr[0] = sums8;
                    outptr += 1;
                }
                else
                {
                    // dequantize
                    ((float*)outptr)[0] = sumfp32;
                    outptr += 4;
                }
            }
        }
    }

    return 0;
}